

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

bool_t prf_state_material_lookup(prf_state_t *state,uint index,prf_material_t *material)

{
  undefined8 uVar1;
  prf_node_t *ppVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  uint32_t *puVar7;
  byte bVar8;
  
  bVar8 = 0;
  ppVar2 = state->material_palette;
  if (ppVar2 == (prf_node_t *)0x0) {
    iVar5 = prf_array_count(state->materials);
    if (iVar5 != 0) {
      lVar6 = 0;
      do {
        puVar7 = (uint32_t *)state->materials[lVar6]->data;
        if (*puVar7 == index) {
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            material->material_index = *puVar7;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
            material = (prf_material_t *)((long)material + (ulong)bVar8 * -8 + 4);
          }
          return 1;
        }
        lVar6 = lVar6 + 1;
      } while (iVar5 != (int)lVar6);
    }
  }
  else if (index < (ppVar2->length >> 3) / 0x17) {
    puVar3 = ppVar2->data;
    lVar6 = (ulong)index * 0xb8;
    material->material_index = index;
    *(undefined8 *)material->name = *(undefined8 *)(puVar3 + lVar6 + 0x3c);
    *(undefined4 *)(material->name + 8) = *(undefined4 *)(puVar3 + lVar6 + 0x44);
    material->flags = *(uint32_t *)(puVar3 + lVar6 + 0x38);
    uVar1 = *(undefined8 *)(puVar3 + lVar6);
    uVar4 = *(undefined8 *)(puVar3 + lVar6 + 8);
    material->ambient_red = (float32_t)(int)uVar1;
    material->ambient_green = (float32_t)(int)((ulong)uVar1 >> 0x20);
    material->ambient_blue = (float32_t)(int)uVar4;
    material->diffuse_red = (float32_t)(int)((ulong)uVar4 >> 0x20);
    uVar1 = *(undefined8 *)(puVar3 + lVar6 + 0x10);
    uVar4 = *(undefined8 *)(puVar3 + lVar6 + 0x10 + 8);
    material->diffuse_green = (float32_t)(int)uVar1;
    material->diffuse_blue = (float32_t)(int)((ulong)uVar1 >> 0x20);
    material->specular_red = (float32_t)(int)uVar4;
    material->specular_green = (float32_t)(int)((ulong)uVar4 >> 0x20);
    uVar1 = *(undefined8 *)(puVar3 + lVar6 + 0x20);
    uVar4 = *(undefined8 *)(puVar3 + lVar6 + 0x20 + 8);
    material->specular_blue = (float32_t)(int)uVar1;
    material->emissive_red = (float32_t)(int)((ulong)uVar1 >> 0x20);
    material->emissive_green = (float32_t)(int)uVar4;
    material->emissive_blue = (float32_t)(int)((ulong)uVar4 >> 0x20);
    uVar1 = *(undefined8 *)(puVar3 + lVar6 + 0x30);
    material->shininess = (float32_t)(int)uVar1;
    material->alpha = (float32_t)(int)((ulong)uVar1 >> 0x20);
    return 1;
  }
  return 0;
}

Assistant:

bool_t
prf_state_material_lookup( 
    prf_state_t * state,
    unsigned int index,
    prf_material_t * material )
{
    unsigned int count, i;
    assert( state != NULL && material != NULL );
    if ( state->material_palette != NULL ) { /* old-style material palette */
        struct prf_material_palette_data * original;
        original = (struct prf_material_palette_data *)
            state->material_palette->data;
        count = state->material_palette->length /
                sizeof( struct prf_material_palette_data );
        if ( index >= count )
            return FALSE;
        original += index;
        material->material_index = index;
        memcpy( material->name, original->name, 12 );
        material->flags = original->flags;
        material->ambient_red   = original->ambient_red;
        material->ambient_green = original->ambient_green;
        material->ambient_blue  = original->ambient_blue;
        material->diffuse_red   = original->diffuse_red;
        material->diffuse_green = original->diffuse_green;
        material->diffuse_blue  = original->diffuse_blue;
        material->specular_red   = original->specular_red;
        material->specular_green = original->specular_green;
        material->specular_blue  = original->specular_blue;
        material->emissive_red   = original->emissive_red;
        material->emissive_green = original->emissive_green;
        material->emissive_blue  = original->emissive_blue;
        material->shininess = original->shininess;
        material->alpha = original->alpha;
        return TRUE;
    } else { /* new material record node set */
        count = prf_array_count( state->materials );
        for ( i = 0; i < count; i++ ) {
            prf_node_t * node;
            prf_material_t * mat;
            node = state->materials[i];
            mat = (prf_material_t *) node->data;
            if ( mat->material_index == index ) {
             /* fprintf(stderr,"mat shininess: %f\n", mat->shininess); */
	        memcpy( material, mat, sizeof( prf_material_t ) );
	        return TRUE;
            }
        }
    }

    return FALSE;
}